

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

RegVmReturnType
ExecutorRegVm::RunCode
          (RegVmCmd *instruction,RegVmRegister *regFilePtr,ExecutorRegVm *rvm,RegVmCmd *codeBase)

{
  uint i_3;
  RegVmReturnType RVar1;
  
  RVar1 = (*(code *)RunCode::switchTable[instruction->code])();
  return RVar1;
}

Assistant:

RegVmReturnType ExecutorRegVm::RunCode(RegVmCmd *instruction, RegVmRegister * const regFilePtr, ExecutorRegVm *rvm, RegVmCmd *codeBase)
{
	(void)codeBase;

#if defined(USE_COMPUTED_GOTO)
	static void* switchTable[] = {
		&&case_rviNop,
		&&case_rviLoadByte,
		&&case_rviLoadWord,
		&&case_rviLoadDword,
		&&case_rviLoadLong,
		&&case_rviLoadFloat,
		&&case_rviLoadDouble,
		&&case_rviLoadImm,
		&&case_rviStoreByte,
		&&case_rviStoreWord,
		&&case_rviStoreDword,
		&&case_rviStoreLong,
		&&case_rviStoreFloat,
		&&case_rviStoreDouble,
		&&case_rviCombinedd,
		&&case_rviBreakupdd,
		&&case_rviMov,
		&&case_rviMovMult,
		&&case_rviDtoi,
		&&case_rviDtol,
		&&case_rviDtof,
		&&case_rviItod,
		&&case_rviLtod,
		&&case_rviItol,
		&&case_rviLtoi,
		&&case_rviIndex,
		&&case_rviGetAddr,
		&&case_rviSetRange,
		&&case_rviMemCopy,
		&&case_rviJmp,
		&&case_rviJmpz,
		&&case_rviJmpnz,
		&&case_rviCall,
		&&case_rviCallPtr,
		&&case_rviReturn,
		&&case_rviAddImm,
		&&case_rviAdd,
		&&case_rviSub,
		&&case_rviMul,
		&&case_rviDiv,
		&&case_rviPow,
		&&case_rviMod,
		&&case_rviLess,
		&&case_rviGreater,
		&&case_rviLequal,
		&&case_rviGequal,
		&&case_rviEqual,
		&&case_rviNequal,
		&&case_rviShl,
		&&case_rviShr,
		&&case_rviBitAnd,
		&&case_rviBitOr,
		&&case_rviBitXor,
		&&case_rviAddImml,
		&&case_rviAddl,
		&&case_rviSubl,
		&&case_rviMull,
		&&case_rviDivl,
		&&case_rviPowl,
		&&case_rviModl,
		&&case_rviLessl,
		&&case_rviGreaterl,
		&&case_rviLequall,
		&&case_rviGequall,
		&&case_rviEquall,
		&&case_rviNequall,
		&&case_rviShll,
		&&case_rviShrl,
		&&case_rviBitAndl,
		&&case_rviBitOrl,
		&&case_rviBitXorl,
		&&case_rviAddd,
		&&case_rviSubd,
		&&case_rviMuld,
		&&case_rviDivd,
		&&case_rviAddf,
		&&case_rviSubf,
		&&case_rviMulf,
		&&case_rviDivf,
		&&case_rviPowd,
		&&case_rviModd,
		&&case_rviLessd,
		&&case_rviGreaterd,
		&&case_rviLequald,
		&&case_rviGequald,
		&&case_rviEquald,
		&&case_rviNequald,
		&&case_rviNeg,
		&&case_rviNegl,
		&&case_rviNegd,
		&&case_rviBitNot,
		&&case_rviBitNotl,
		&&case_rviLogNot,
		&&case_rviLogNotl,
		&&case_rviConvertPtr,
	};

#define SWITCH goto *switchTable[instruction->code];
#define CASE(x) case_##x:
#define BREAK goto *switchTable[instruction->code]
#else
#define SWITCH switch(cmd.code)
#define CASE(x) case x:
#define BREAK break
#endif

	for(;;)
	{
#if defined(USE_COMPUTED_GOTO)
#define cmd (*instruction)
#else
		const RegVmCmd &cmd = *instruction;
#endif

#if defined(NULLC_REG_VM_PROFILE_INSTRUCTIONS)
		unsigned *executions = rvm->exLinker->exRegVmExecCount.data;

		executions[unsigned(instruction - codeBase)]++;

		unsigned *instructionExecutions = rvm->exLinker->exRegVmInstructionExecCount.data;

		instructionExecutions[cmd.code]++;
#endif

		SWITCH
		{
		CASE(rviNop)
			instruction = rvm->ExecNop(cmd, instruction, regFilePtr);

			if(!instruction)
				return rvrError;

			BREAK;
		CASE(rviLoadByte)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = *(char*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLoadWord)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = *(short*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLoadDword)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLoadLong)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = vmLoadLong((void*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument));
			instruction++;
			BREAK;
		CASE(rviLoadFloat)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = *(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLoadDouble)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLoadImm)
			regFilePtr[cmd.rA].intValue = cmd.argument;
			instruction++;
			BREAK;
		CASE(rviStoreByte)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(char*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = (char)regFilePtr[cmd.rA].intValue;
			instruction++;
			BREAK;
		CASE(rviStoreWord)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(short*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = (short)regFilePtr[cmd.rA].intValue;
			instruction++;
			BREAK;
		CASE(rviStoreDword)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = regFilePtr[cmd.rA].intValue;
			instruction++;
			BREAK;
		CASE(rviStoreLong)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = regFilePtr[cmd.rA].longValue;
			instruction++;
			BREAK;
		CASE(rviStoreFloat)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = (float)regFilePtr[cmd.rA].doubleValue;
			instruction++;
			BREAK;
		CASE(rviStoreDouble)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			*(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) = regFilePtr[cmd.rA].doubleValue;
			instruction++;
			BREAK;
		CASE(rviCombinedd)
			regFilePtr[cmd.rA].longValue = ((uint64_t)regFilePtr[cmd.rC].intValue << 32ull) | (unsigned)regFilePtr[cmd.rB].intValue;
			instruction++;
			BREAK;
		CASE(rviBreakupdd)
			regFilePtr[cmd.rA].intValue = (int)(regFilePtr[cmd.rC].longValue >> 32ull);
			regFilePtr[cmd.rB].intValue = (int)(regFilePtr[cmd.rC].longValue);
			instruction++;
			BREAK;
		CASE(rviMov)
			memcpy(&regFilePtr[cmd.rA], &regFilePtr[cmd.rC], sizeof(RegVmRegister));
			instruction++;
			BREAK;
		CASE(rviMovMult)
			memcpy(&regFilePtr[cmd.rA], &regFilePtr[cmd.rC], sizeof(RegVmRegister));
			memcpy(&regFilePtr[cmd.argument >> 24], &regFilePtr[(cmd.argument >> 16) & 0xff], sizeof(RegVmRegister));
			memcpy(&regFilePtr[(cmd.argument >> 8) & 0xff], &regFilePtr[cmd.argument & 0xff], sizeof(RegVmRegister));
			instruction++;
			BREAK;
		CASE(rviDtoi)
			regFilePtr[cmd.rA].intValue = (int)regFilePtr[cmd.rC].doubleValue;
			instruction++;
			BREAK;
		CASE(rviDtol)
			regFilePtr[cmd.rA].longValue = (long long)regFilePtr[cmd.rC].doubleValue;
			instruction++;
			BREAK;
		CASE(rviDtof)
			{
				float tmp = (float)regFilePtr[cmd.rC].doubleValue;

				memcpy(&regFilePtr[cmd.rA].intValue, &tmp, sizeof(float));
			}
			instruction++;
			BREAK;
		CASE(rviItod)
			regFilePtr[cmd.rA].doubleValue = (double)regFilePtr[cmd.rC].intValue;
			instruction++;
			BREAK;
		CASE(rviLtod)
			regFilePtr[cmd.rA].doubleValue = (double)regFilePtr[cmd.rC].longValue;
			instruction++;
			BREAK;
		CASE(rviItol)
			regFilePtr[cmd.rA].longValue = (long long)regFilePtr[cmd.rC].intValue;
			instruction++;
			BREAK;
		CASE(rviLtoi)
			regFilePtr[cmd.rA].intValue = (int)regFilePtr[cmd.rC].longValue;
			instruction++;
			BREAK;
		CASE(rviIndex)
			if(unsigned(regFilePtr[cmd.rB].intValue) >= unsigned(regFilePtr[(cmd.argument >> 16) & 0xff].intValue))
				return rvm->ExecError(instruction, "ERROR: array index out of bounds");

			regFilePtr[cmd.rA].ptrValue = regFilePtr[cmd.rC].ptrValue + regFilePtr[cmd.rB].intValue * (cmd.argument & 0xffff);
			instruction++;
			BREAK;
		CASE(rviGetAddr)
			regFilePtr[cmd.rA].ptrValue = regFilePtr[cmd.rC].ptrValue + cmd.argument;
			instruction++;
			BREAK;
		CASE(rviSetRange)
			switch(RegVmSetRangeType(cmd.rB))
			{
			case rvsrDouble:

				for(unsigned i = 0; i < cmd.argument; i++)
					((double*)regFilePtr[cmd.rC].ptrValue)[i] = regFilePtr[cmd.rA].doubleValue;
				break;
			case rvsrFloat:

				for(unsigned i = 0; i < cmd.argument; i++)
					((float*)regFilePtr[cmd.rC].ptrValue)[i] = (float)regFilePtr[cmd.rA].doubleValue;
				break;
			case rvsrLong:

				for(unsigned i = 0; i < cmd.argument; i++)
					((long long*)regFilePtr[cmd.rC].ptrValue)[i] = regFilePtr[cmd.rA].longValue;
				break;
			case rvsrInt:

				for(unsigned i = 0; i < cmd.argument; i++)
					((int*)regFilePtr[cmd.rC].ptrValue)[i] = regFilePtr[cmd.rA].intValue;
				break;
			case rvsrShort:

				for(unsigned i = 0; i < cmd.argument; i++)
					((short*)regFilePtr[cmd.rC].ptrValue)[i] = (short)regFilePtr[cmd.rA].intValue;
				break;
			case rvsrChar:

				for(unsigned i = 0; i < cmd.argument; i++)
					((char*)regFilePtr[cmd.rC].ptrValue)[i] = (char)regFilePtr[cmd.rA].intValue;
				break;
			default:
				assert(!"unknown type");
			}
			instruction++;
			BREAK;
		CASE(rviMemCopy)
			if((uintptr_t)regFilePtr[cmd.rA].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			memcpy((void*)regFilePtr[cmd.rA].ptrValue, (void*)regFilePtr[cmd.rC].ptrValue, cmd.argument);
			instruction++;
			BREAK;
		CASE(rviJmp)
#ifdef _M_X64
			instruction = codeBase + cmd.argument - 1;
#else
			instruction = rvm->codeBase + cmd.argument - 1;
#endif
			instruction++;
			BREAK;
		CASE(rviJmpz)
			if(regFilePtr[cmd.rC].intValue == 0)
			{
#ifdef _M_X64
				instruction = codeBase + cmd.argument - 1;
#else
				instruction = rvm->codeBase + cmd.argument - 1;
#endif
			}
			instruction++;
			BREAK;
		CASE(rviJmpnz)
			if(regFilePtr[cmd.rC].intValue != 0)
			{
#ifdef _M_X64
				instruction = codeBase + cmd.argument - 1;
#else
				instruction = rvm->codeBase + cmd.argument - 1;
#endif
			}
			instruction++;
			BREAK;
		CASE(rviCall)
			if(!rvm->ExecCall((cmd.rA << 16) | (cmd.rB << 8) | cmd.rC, cmd.argument, instruction, regFilePtr))
				return rvrError;

			instruction++;
			BREAK;
		CASE(rviCallPtr)

			if(regFilePtr[cmd.rC].intValue == 0)
				return rvm->ExecError(instruction, "ERROR: invalid function pointer");

			if(!rvm->ExecCall(cmd.argument, regFilePtr[cmd.rC].intValue, instruction, regFilePtr))
				return rvrError;

			instruction++;
			BREAK;
		CASE(rviReturn)
			return rvm->ExecReturn(cmd, instruction, regFilePtr);
		CASE(rviAddImm)
			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue + (int)cmd.argument;
			instruction++;
			BREAK;
		CASE(rviAdd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue + *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviSub)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue - *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviMul)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue * *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviDiv)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			if(*(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) == 0)
				return rvm->ExecError(instruction, "ERROR: integer division by zero");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue / *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviPow)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = VmIntPow(*(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument), regFilePtr[cmd.rB].intValue);
			instruction++;
			BREAK;
		CASE(rviMod)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			if(*(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) == 0)
				return rvm->ExecError(instruction, "ERROR: integer division by zero");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue % *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLess)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue < *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGreater)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue > *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLequal)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue <= *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGequal)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue >= *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviEqual)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue == *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviNequal)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue != *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviShl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue << *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviShr)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue >> *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitAnd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue & *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitOr)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue | *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitXor)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].intValue ^ *(int*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviAddImml)
			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue + (int)cmd.argument;
			instruction++;
			BREAK;
		CASE(rviAddl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue + *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviSubl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue - *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviMull)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue * *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviDivl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			if(*(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) == 0)
				return rvm->ExecError(instruction, "ERROR: integer division by zero");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue / *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviPowl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = VmLongPow(*(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument), regFilePtr[cmd.rB].longValue);
			instruction++;
			BREAK;
		CASE(rviModl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			if(*(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument) == 0)
				return rvm->ExecError(instruction, "ERROR: integer division by zero");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue % *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLessl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue < *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGreaterl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue > *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLequall)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue <= *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGequall)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue >= *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviEquall)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue == *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviNequall)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].longValue != *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviShll)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue << *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviShrl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue >> *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitAndl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue & *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitOrl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue | *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviBitXorl)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].longValue = regFilePtr[cmd.rB].longValue ^ *(long long*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviAddd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue + *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviSubd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue - *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviMuld)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue * *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviDivd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue / *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviAddf)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue + *(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviSubf)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue - *(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviMulf)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue * *(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviDivf)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = regFilePtr[cmd.rB].doubleValue / *(float*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviPowd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = pow(regFilePtr[cmd.rB].doubleValue, *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument));
			instruction++;
			BREAK;
		CASE(rviModd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].doubleValue = fmod(regFilePtr[cmd.rB].doubleValue, *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument));
			instruction++;
			BREAK;
		CASE(rviLessd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue < *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGreaterd)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue > *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviLequald)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue <= *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviGequald)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue >= *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviEquald)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue == *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviNequald)
			if((uintptr_t)regFilePtr[cmd.rC].ptrValue < 0x00010000)
				return rvm->ExecError(instruction, "ERROR: null pointer access");

			regFilePtr[cmd.rA].intValue = regFilePtr[cmd.rB].doubleValue != *(double*)(uintptr_t)(regFilePtr[cmd.rC].ptrValue + cmd.argument);
			instruction++;
			BREAK;
		CASE(rviNeg)
			regFilePtr[cmd.rA].intValue = -regFilePtr[cmd.rC].intValue;
			instruction++;
			BREAK;
		CASE(rviNegl)
			regFilePtr[cmd.rA].longValue = -regFilePtr[cmd.rC].longValue;
			instruction++;
			BREAK;
		CASE(rviNegd)
			regFilePtr[cmd.rA].doubleValue = -regFilePtr[cmd.rC].doubleValue;
			instruction++;
			BREAK;
		CASE(rviBitNot)
			regFilePtr[cmd.rA].intValue = ~regFilePtr[cmd.rC].intValue;
			instruction++;
			BREAK;
		CASE(rviBitNotl)
			regFilePtr[cmd.rA].longValue = ~regFilePtr[cmd.rC].longValue;
			instruction++;
			BREAK;
		CASE(rviLogNot)
			regFilePtr[cmd.rA].intValue = !regFilePtr[cmd.rC].intValue;
			instruction++;
			BREAK;
		CASE(rviLogNotl)
			regFilePtr[cmd.rA].intValue = !regFilePtr[cmd.rC].longValue;
			instruction++;
			BREAK;
		CASE(rviConvertPtr)
			if(!rvm->ExecConvertPtr(cmd, instruction, regFilePtr))
				return rvrError;

			instruction++;
			BREAK;
#if !defined(USE_COMPUTED_GOTO)
		default:
#if defined(_MSC_VER)
			__assume(false);
#elif defined(__GNUC__)
			__builtin_unreachable();
#endif
#endif
		}
	}